

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

size_t __thiscall
CoreML::Specification::Convolution3DLayerParams::ByteSizeLong(Convolution3DLayerParams *this)

{
  size_t sVar1;
  size_t sVar2;
  long lVar3;
  int value;
  
  sVar1 = google::protobuf::internal::WireFormatLite::UInt64Size(&this->outputshape_);
  if (sVar1 == 0) {
    value = 0;
    lVar3 = 0;
  }
  else {
    value = (int)sVar1;
    sVar2 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(value);
    lVar3 = sVar2 + 2;
  }
  this->_outputshape_cached_byte_size_ = value;
  sVar1 = lVar3 + sVar1;
  if (this->weights_ != (WeightParams *)0x0 &&
      this != (Convolution3DLayerParams *)&_Convolution3DLayerParams_default_instance_) {
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::WeightParams>(this->weights_);
    sVar1 = sVar1 + sVar2 + 2;
  }
  if (this->bias_ != (WeightParams *)0x0 &&
      this != (Convolution3DLayerParams *)&_Convolution3DLayerParams_default_instance_) {
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::WeightParams>(this->bias_);
    sVar1 = sVar1 + sVar2 + 2;
  }
  if (this->outputchannels_ != 0) {
    sVar2 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(this->outputchannels_)
    ;
    sVar1 = sVar1 + sVar2 + 1;
  }
  if (this->inputchannels_ != 0) {
    sVar2 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(this->inputchannels_);
    sVar1 = sVar1 + sVar2 + 1;
  }
  if (this->ngroups_ != 0) {
    sVar2 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(this->ngroups_);
    sVar1 = sVar1 + sVar2 + 1;
  }
  if (this->kerneldepth_ != 0) {
    sVar2 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(this->kerneldepth_);
    sVar1 = sVar1 + sVar2 + 2;
  }
  if (this->kernelheight_ != 0) {
    sVar2 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(this->kernelheight_);
    sVar1 = sVar1 + sVar2 + 2;
  }
  if (this->kernelwidth_ != 0) {
    sVar2 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(this->kernelwidth_);
    sVar1 = sVar1 + sVar2 + 2;
  }
  if (this->stridedepth_ != 0) {
    sVar2 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(this->stridedepth_);
    sVar1 = sVar1 + sVar2 + 2;
  }
  if (this->strideheight_ != 0) {
    sVar2 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(this->strideheight_);
    sVar1 = sVar1 + sVar2 + 2;
  }
  if (this->stridewidth_ != 0) {
    sVar2 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(this->stridewidth_);
    sVar1 = sVar1 + sVar2 + 2;
  }
  if (this->dilationdepth_ != 0) {
    sVar2 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(this->dilationdepth_);
    sVar1 = sVar1 + sVar2 + 2;
  }
  if (this->dilationheight_ != 0) {
    sVar2 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(this->dilationheight_)
    ;
    sVar1 = sVar1 + sVar2 + 2;
  }
  if (this->dilationwidth_ != 0) {
    sVar2 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(this->dilationwidth_);
    sVar1 = sVar1 + sVar2 + 2;
  }
  sVar2 = sVar1 + 3;
  if (this->hasbias_ == false) {
    sVar2 = sVar1;
  }
  sVar1 = sVar2 + 3;
  if (this->isdeconvolution_ == false) {
    sVar1 = sVar2;
  }
  if (this->paddingtype_ != 0) {
    sVar2 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(this->paddingtype_);
    sVar1 = sVar1 + sVar2 + 2;
  }
  if (this->custompaddingfront_ != 0) {
    sVar2 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended
                      (this->custompaddingfront_);
    sVar1 = sVar1 + sVar2 + 2;
  }
  if (this->custompaddingback_ != 0) {
    sVar2 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended
                      (this->custompaddingback_);
    sVar1 = sVar1 + sVar2 + 2;
  }
  if (this->custompaddingtop_ != 0) {
    sVar2 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended
                      (this->custompaddingtop_);
    sVar1 = sVar1 + sVar2 + 2;
  }
  if (this->custompaddingbottom_ != 0) {
    sVar2 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended
                      (this->custompaddingbottom_);
    sVar1 = sVar1 + sVar2 + 2;
  }
  if (this->custompaddingleft_ != 0) {
    sVar2 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended
                      (this->custompaddingleft_);
    sVar1 = sVar1 + sVar2 + 2;
  }
  if (this->custompaddingright_ != 0) {
    sVar2 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended
                      (this->custompaddingright_);
    sVar1 = sVar1 + sVar2 + 2;
  }
  this->_cached_size_ = (int)sVar1;
  return sVar1;
}

Assistant:

size_t Convolution3DLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.Convolution3DLayerParams)
  size_t total_size = 0;

  // repeated uint64 outputShape = 87;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      UInt64Size(this->outputshape_);
    if (data_size > 0) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _outputshape_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // .CoreML.Specification.WeightParams weights = 60;
  if (this->has_weights()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->weights_);
  }

  // .CoreML.Specification.WeightParams bias = 61;
  if (this->has_bias()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->bias_);
  }

  // int32 outputChannels = 1;
  if (this->outputchannels() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->outputchannels());
  }

  // int32 inputChannels = 2;
  if (this->inputchannels() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->inputchannels());
  }

  // int32 nGroups = 10;
  if (this->ngroups() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->ngroups());
  }

  // int32 kernelDepth = 20;
  if (this->kerneldepth() != 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->kerneldepth());
  }

  // int32 kernelHeight = 21;
  if (this->kernelheight() != 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->kernelheight());
  }

  // int32 kernelWidth = 22;
  if (this->kernelwidth() != 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->kernelwidth());
  }

  // int32 strideDepth = 31;
  if (this->stridedepth() != 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->stridedepth());
  }

  // int32 strideHeight = 32;
  if (this->strideheight() != 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->strideheight());
  }

  // int32 strideWidth = 33;
  if (this->stridewidth() != 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->stridewidth());
  }

  // int32 dilationDepth = 40;
  if (this->dilationdepth() != 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->dilationdepth());
  }

  // int32 dilationHeight = 41;
  if (this->dilationheight() != 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->dilationheight());
  }

  // int32 dilationWidth = 42;
  if (this->dilationwidth() != 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->dilationwidth());
  }

  // bool hasBias = 50;
  if (this->hasbias() != 0) {
    total_size += 2 + 1;
  }

  // bool isDeconvolution = 86;
  if (this->isdeconvolution() != 0) {
    total_size += 2 + 1;
  }

  // .CoreML.Specification.Convolution3DLayerParams.PaddingType paddingType = 70;
  if (this->paddingtype() != 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->paddingtype());
  }

  // int32 customPaddingFront = 80;
  if (this->custompaddingfront() != 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->custompaddingfront());
  }

  // int32 customPaddingBack = 81;
  if (this->custompaddingback() != 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->custompaddingback());
  }

  // int32 customPaddingTop = 82;
  if (this->custompaddingtop() != 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->custompaddingtop());
  }

  // int32 customPaddingBottom = 83;
  if (this->custompaddingbottom() != 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->custompaddingbottom());
  }

  // int32 customPaddingLeft = 84;
  if (this->custompaddingleft() != 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->custompaddingleft());
  }

  // int32 customPaddingRight = 85;
  if (this->custompaddingright() != 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->custompaddingright());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}